

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

UInt32 LitEnc_GetPrice(UInt16 *probs,UInt32 symbol,UInt32 *ProbPrices)

{
  UInt32 price;
  UInt32 *ProbPrices_local;
  UInt32 symbol_local;
  UInt16 *probs_local;
  
  price = 0;
  symbol_local = symbol | 0x100;
  do {
    price = ProbPrices
            [(int)((uint)probs[symbol_local >> 8] ^ -(symbol_local >> 7 & 1) & 0x7ff) >> 4] + price;
    symbol_local = symbol_local << 1;
  } while (symbol_local < 0x10000);
  return price;
}

Assistant:

static UInt32 LitEnc_GetPrice(const CLzmaProb *probs, UInt32 symbol, const UInt32 *ProbPrices)
{
  UInt32 price = 0;
  symbol |= 0x100;
  do
  {
    price += GET_PRICEa(probs[symbol >> 8], (symbol >> 7) & 1);
    symbol <<= 1;
  }
  while (symbol < 0x10000);
  return price;
}